

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

char * google::GetHex(char *start,char *end,uint64_t *hex)

{
  uint uVar1;
  int local_3c;
  char *pcStack_28;
  int ch;
  char *p;
  uint64_t *hex_local;
  char *end_local;
  char *start_local;
  
  *hex = 0;
  for (pcStack_28 = start;
      (pcStack_28 < end &&
      ((((uVar1 = (uint)*pcStack_28, 0x2f < (int)uVar1 && ((int)uVar1 < 0x3a)) ||
        ((0x40 < (int)uVar1 && ((int)uVar1 < 0x47)))) ||
       ((0x60 < (int)uVar1 && ((int)uVar1 < 0x67)))))); pcStack_28 = pcStack_28 + 1) {
    if ((int)uVar1 < 0x41) {
      local_3c = uVar1 - 0x30;
    }
    else {
      local_3c = (uVar1 & 0xf) + 9;
    }
    *hex = *hex << 4 | (long)local_3c;
  }
  if (end < pcStack_28) {
    AssertFail();
  }
  return pcStack_28;
}

Assistant:

static char *GetHex(const char *start, const char *end, uint64_t *hex) {
  *hex = 0;
  const char *p;
  for (p = start; p < end; ++p) {
    int ch = *p;
    if ((ch >= '0' && ch <= '9') ||
        (ch >= 'A' && ch <= 'F') || (ch >= 'a' && ch <= 'f')) {
      *hex = (*hex << 4) | (ch < 'A' ? ch - '0' : (ch & 0xF) + 9);
    } else {  // Encountered the first non-hex character.
      break;
    }
  }
  SAFE_ASSERT(p <= end);
  return const_cast<char *>(p);
}